

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
boost::ext::ut::v1_1_8::utility::
split<std::basic_string_view<char,std::char_traits<char>>,char_const*>
          (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,utility *this,
          basic_string_view<char,_std::char_traits<char>_> input,char *delim)

{
  size_type sVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  size_type second;
  size_t first;
  char *local_28;
  char *delim_local;
  basic_string_view<char,_std::char_traits<char>_> input_local;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *output;
  
  local_28 = input._M_str;
  input_local._M_len = input._M_len;
  first._7_1_ = 0;
  delim_local = (char *)this;
  input_local._M_str = (char *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(__return_storage_ptr__);
  second = 0;
  while( true ) {
    sVar1 = second;
    sVar2 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local);
    if (sVar2 <= sVar1) {
      return __return_storage_ptr__;
    }
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local,local_28,
                          second);
    if (second != local_40) {
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local,second,
                         local_40 - second);
      local_50 = bVar3;
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,&local_50);
    }
    if (local_40 == 0xffffffffffffffff) break;
    second = local_40 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline auto split(T input, TDelim delim) -> std::vector<T> {
    std::vector<T> output{};
    std::size_t first{};
    while (first < std::size(input)) {
      const auto second = input.find_first_of(delim, first);
      if (first != second) {
        output.emplace_back(input.substr(first, second - first));
      }
      if (second == T::npos) {
        break;
      }
      first = second + 1;
    }
    return output;
  }